

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_or.h
# Opt level: O2

void __thiscall
mp::
OrConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertCtxPos(OrConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *this,ItemType_conflict14 *disj,int param_2)

{
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  *this_00;
  allocator_type local_169;
  value_type_conflict local_168;
  vector<double,_std::allocator<double>_> ones;
  Arguments flags;
  LinTerms local_130;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> local_b8;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&flags,&(disj->
                     super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                     ).args_);
  ones.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = (disj->super_FunctionalConstraint).result_var_;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&flags,(int *)&ones);
  local_168 = 1.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&ones,(long)(disj->
                         super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                         ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(disj->
                         super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                         ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2,&local_168,&local_169);
  local_168 = -1.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&ones,&local_168);
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
             *)(this->
               super_BasicFuncConstrCvt<mp::OrConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).
               super_BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               .mdl_cvt_;
  LinTerms::LinTerms(&local_130,&ones,&flags);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
            (&local_b8,&local_130,(AlgConRhs<1>)0x0,true);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>(this_00,&local_b8);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint(&local_b8);
  LinTerms::~LinTerms(&local_130);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ones.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&flags.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void ConvertCtxPos(const ItemType& disj, int ) {
    const auto& args = disj.GetArguments();
    auto flags = args;
    flags.push_back(disj.GetResultVar());
    std::vector<double> ones(args.size(), 1.0);  // res <= sum(args) in CTX+
    ones.push_back(-1.0);
    GetMC().AddConstraint(
                   LinConGE({ones, flags}, {0.0} ));
  }